

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O3

shared_ptr<simple_thread_pool::TaskHandle> __thiscall
simple_thread_pool::ThreadPoolMgr::getTaskToRun
          (ThreadPoolMgr *this,uint64_t *next_sleep_hint_us_inout)

{
  _List_node_base *this_00;
  _func_int **pp_Var1;
  _List_node_base *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  iterator iVar7;
  shared_ptr<simple_thread_pool::TaskHandle> sVar8;
  uint64_t remaining_us;
  uint64_t local_40;
  uint64_t *local_38;
  
  (this->super_ThreadPoolMgrBase)._vptr_ThreadPoolMgrBase = (_func_int **)0x0;
  this->MAX_SLEEP_US = 0;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)(next_sleep_hint_us_inout + 0x17));
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  this_00 = (_List_node_base *)(next_sleep_hint_us_inout + 0x14);
  iVar7._M_node = (_List_node_base *)next_sleep_hint_us_inout[0x14];
  if (iVar7._M_node != this_00) {
    local_38 = &this->MAX_SLEEP_US;
    do {
      local_40 = 0;
      bVar3 = TaskHandle::timeToFire((TaskHandle *)iVar7._M_node[1]._M_next,&local_40);
      if (bVar3) {
        (this->super_ThreadPoolMgrBase)._vptr_ThreadPoolMgrBase =
             (_func_int **)iVar7._M_node[1]._M_next;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_38,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&iVar7._M_node[1]._M_prev);
        pp_Var1 = (this->super_ThreadPoolMgrBase)._vptr_ThreadPoolMgrBase;
        if ((*(int *)pp_Var1 == 0) || (*(int *)(pp_Var1 + 0xd) == 2)) {
          p_Var2 = (iVar7._M_node)->_M_next;
          std::__cxx11::
          list<std::shared_ptr<simple_thread_pool::TaskHandle>,_std::allocator<std::shared_ptr<simple_thread_pool::TaskHandle>_>_>
          ::_M_erase((list<std::shared_ptr<simple_thread_pool::TaskHandle>,_std::allocator<std::shared_ptr<simple_thread_pool::TaskHandle>_>_>
                      *)this_00,iVar7);
          iVar7._M_node = p_Var2;
        }
        else {
          TaskHandle::reschedule
                    ((TaskHandle *)(this->super_ThreadPoolMgrBase)._vptr_ThreadPoolMgrBase,-1);
        }
        if (*(int *)((this->super_ThreadPoolMgrBase)._vptr_ThreadPoolMgrBase + 0xd) != 2) break;
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->MAX_SLEEP_US;
        (this->super_ThreadPoolMgrBase)._vptr_ThreadPoolMgrBase = (_func_int **)0x0;
        this->MAX_SLEEP_US = 0;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          goto LAB_0010808a;
        }
LAB_00108090:
        iVar7._M_node =
             (((_List_base<std::shared_ptr<simple_thread_pool::TaskHandle>,_std::allocator<std::shared_ptr<simple_thread_pool::TaskHandle>_>_>
                *)&(iVar7._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        if (in_RDX != (ulong *)0x0) {
          uVar5 = *in_RDX;
          if (local_40 < *in_RDX) {
            uVar5 = local_40;
          }
          *in_RDX = uVar5;
          if (next_sleep_hint_us_inout[1] < uVar5) {
            uVar5 = next_sleep_hint_us_inout[1];
          }
          *in_RDX = uVar5;
        }
      }
      else {
LAB_0010808a:
        if ((this->super_ThreadPoolMgrBase)._vptr_ThreadPoolMgrBase == (_func_int **)0x0)
        goto LAB_00108090;
      }
    } while (iVar7._M_node != this_00);
  }
  pthread_mutex_unlock((pthread_mutex_t *)(next_sleep_hint_us_inout + 0x17));
  _Var6._M_pi = extraout_RDX;
  if ((this->super_ThreadPoolMgrBase)._vptr_ThreadPoolMgrBase == (_func_int **)0x0) {
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)(next_sleep_hint_us_inout + 0x1f));
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
    iVar7._M_node = (_List_node_base *)next_sleep_hint_us_inout[0x1c];
    if (iVar7._M_node != (_List_node_base *)(next_sleep_hint_us_inout + 0x1c)) {
      (this->super_ThreadPoolMgrBase)._vptr_ThreadPoolMgrBase =
           (_func_int **)iVar7._M_node[1]._M_next;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->MAX_SLEEP_US,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&iVar7._M_node[1]._M_prev);
      std::__cxx11::
      list<std::shared_ptr<simple_thread_pool::TaskHandle>,_std::allocator<std::shared_ptr<simple_thread_pool::TaskHandle>_>_>
      ::_M_erase((list<std::shared_ptr<simple_thread_pool::TaskHandle>,_std::allocator<std::shared_ptr<simple_thread_pool::TaskHandle>_>_>
                  *)(next_sleep_hint_us_inout + 0x1c),iVar7);
    }
    if ((in_RDX != (ulong *)0x0) && (next_sleep_hint_us_inout[0x1e] != 0)) {
      *in_RDX = 0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)(next_sleep_hint_us_inout + 0x1f));
    _Var6._M_pi = extraout_RDX_00;
  }
  sVar8.super___shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var6._M_pi;
  sVar8.super___shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<simple_thread_pool::TaskHandle>)
         sVar8.super___shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TaskHandle> getTaskToRun
                                (uint64_t* next_sleep_hint_us_inout = nullptr)
    {
        // Check timer task first (higher priority).
        std::shared_ptr<TaskHandle> task_to_run = nullptr;
        {   std::lock_guard<std::mutex> l(timedTasksLock);
            auto entry = timedTasks.begin();
            while (entry != timedTasks.end()) {
                std::shared_ptr<TaskHandle>& tt = *entry;
                uint64_t remaining_us = 0;
                if (tt->timeToFire(remaining_us)) {
                    task_to_run = tt;
                    if ( task_to_run->isOneTime() ||
                         task_to_run->isDone() ) {
                        entry = timedTasks.erase(entry);
                    } else {
                        task_to_run->reschedule();
                    }

                    if (task_to_run->isDone()) task_to_run.reset();
                    else break;
                }
                if (!task_to_run) {
                    entry++;
                    // Adjust next sleep time.
                    if (next_sleep_hint_us_inout) {
                        *next_sleep_hint_us_inout = std::min(*next_sleep_hint_us_inout,
                                                             remaining_us);
                        *next_sleep_hint_us_inout = std::min(*next_sleep_hint_us_inout,
                                                             MAX_SLEEP_US);
                    }
                }
            }
        }

        if (!task_to_run) {
            // If there is no timer task to be fired for now,
            // pick a normal task.
            std::lock_guard<std::mutex> l(normalTasksLock);
            auto entry = normalTasks.begin();
            if (entry != normalTasks.end()) {
                task_to_run = *entry;
                normalTasks.erase(entry);
            }

            if (normalTasks.size()) {
                // Still have pending task(s). Do not sleep.
                if (next_sleep_hint_us_inout) {
                    *next_sleep_hint_us_inout = 0;
                }
            }
        }
        return task_to_run;
    }